

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O0

void stack_check(StackWord *start68k)

{
  StackWord SVar1;
  ushort uVar2;
  bool bVar3;
  StackWord *SAddr;
  DLword DVar4;
  DLword DVar5;
  StackWord SVar6;
  LispPTR LVar7;
  LispPTR LVar8;
  StackWord *pSVar9;
  undefined2 local_2e;
  undefined2 local_2c;
  DLword freesize;
  DLword setflg;
  DLword savestack2;
  DLword savestack1;
  DLword save_nextblock;
  DLword *top_ivar;
  StackWord *endstack68k;
  StackWord *scanptr68k;
  StackWord *start68k_local;
  
  bVar3 = false;
  DVar5 = MachineState.pvar[-5];
  DVar4 = StackOffsetFromNative(MachineState.csp);
  if ((DVar5 != DVar4) || (MachineState.csp[1] != 0xa000)) {
    if (MachineState.csp <= MachineState.pvar + -10) {
      warn("CURRENTFX >= CurrentStackPTR??\n");
      LVar7 = LAddrFromNative(MachineState.pvar + -10);
      LVar8 = LAddrFromNative(MachineState.csp);
      printf("CURRENTFX=0x%x,CurrentStackPTR=0x%x\n",(ulong)LVar7,(ulong)LVar8);
    }
    bVar3 = true;
    printf("set CURRENTFX->nextblock in debugger. But it will be reset after this check \n");
    freesize = MachineState.pvar[-5];
    local_2c = *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2);
    local_2e = *(undefined2 *)((ulong)(MachineState.csp + 3) ^ 2);
    DVar5 = StackOffsetFromNative(MachineState.csp + 2);
    MachineState.pvar[-5] = DVar5;
    *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2) = 0xa000;
    *(short *)((ulong)(MachineState.csp + 3) ^ 2) =
         (short)((ulong)((long)MachineState.endofstack - (long)(MachineState.csp + 2)) >> 1);
  }
  endstack68k = start68k;
  if (start68k == (StackWord *)0x0) {
    endstack68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->stackbase);
  }
  pSVar9 = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->endofstack);
  if (*(ushort *)((ulong)pSVar9 ^ 2) >> 0xd != 7) {
    printf("?? endstack is not GUARD BLK\n");
  }
  while (SAddr = endstack68k, endstack68k < pSVar9) {
    uVar2 = *(ushort *)((ulong)endstack68k ^ 2) >> 0xd;
    if (uVar2 == 5) {
      SVar1 = *endstack68k;
      if (SVar1 == (StackWord)0x0) {
        warn("FSB freesize = 0!");
      }
      endstack68k = endstack68k + (int)(uint)(ushort)SVar1;
      putchar(0x46);
    }
    else if (uVar2 == 6) {
      endstack68k = (StackWord *)NativeAligned2FromStackOffset((DLword)endstack68k[5]);
      putchar(0x58);
    }
    else if (uVar2 == 7) {
      SVar1 = *endstack68k;
      if (SVar1 == (StackWord)0x0) {
        warn("Guard block freesize = 0!");
      }
      endstack68k = endstack68k + (int)(uint)(ushort)SVar1;
      putchar(0x47);
    }
    else {
      for (; *(ushort *)((ulong)endstack68k ^ 2) >> 0xd != 4; endstack68k = endstack68k + 2) {
        if (*(ushort *)((ulong)endstack68k ^ 2) >> 0xd != 0) {
          warn("StackCheck:!=STK_NOTFLG");
          printf("content:0x%x\n",(ulong)*(ushort *)((ulong)endstack68k ^ 2));
        }
      }
      if (((ushort)endstack68k[1] >> 9 & 1) == 0) {
        SVar1 = *endstack68k;
        SVar6 = (StackWord)StackOffsetFromNative(SAddr);
        if (SVar1 != SVar6) {
          LVar7 = LAddrFromNative(endstack68k);
          printf("BF doesn\'t point TopIVAR:0x%x\n",(ulong)LVar7);
        }
      }
      else if (endstack68k != SAddr) {
        LVar7 = LAddrFromNative(endstack68k);
        printf("Residual has real IVAR:0x%x\n",(ulong)LVar7);
      }
      endstack68k = endstack68k + 2;
      putchar(0x42);
    }
    if ((endstack68k != start68k) && (pSVar9 < endstack68k)) {
      warn("scanptr exceeded end stack");
      printf("scanptr68k=%p endstack68k=%p",endstack68k,pSVar9);
    }
  }
  printf("\nStack Check done\n");
  if (bVar3) {
    MachineState.pvar[-5] = freesize;
    *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2) = local_2c;
    *(undefined2 *)((ulong)(MachineState.csp + 3) ^ 2) = local_2e;
  }
  return;
}

Assistant:

void stack_check(StackWord *start68k) {
  StackWord *scanptr68k;
  StackWord *endstack68k;
  DLword *top_ivar;
  DLword save_nextblock;
  DLword savestack1, savestack2;
  DLword setflg = NIL;
  DLword freesize;

#ifdef FSBCHECK
  bigFSBindex = 0;
  memset((char *)bigFSB, 0, sizeof(bigFSB));
#endif

  if ((CURRENTFX->nextblock != StackOffsetFromNative(CurrentStackPTR)) || (!FSBP(CurrentStackPTR))) {
    if ((DLword *)CURRENTFX >= CurrentStackPTR) {
      WARN("CURRENTFX >= CurrentStackPTR??\n",
           printf("CURRENTFX=0x%x,CurrentStackPTR=0x%x\n", LAddrFromNative(CURRENTFX),
                  LAddrFromNative(CurrentStackPTR)));
    }
    setflg = T;
    printf("set CURRENTFX->nextblock in debugger. But it will be reset after this check \n");
    save_nextblock = CURRENTFX->nextblock;
    savestack1 = GETWORD(CurrentStackPTR + 2);
    savestack2 = GETWORD(CurrentStackPTR + 3);
    CURRENTFX->nextblock = StackOffsetFromNative(CurrentStackPTR + 2);
    GETWORD(CurrentStackPTR + 2) = STK_FSB_WORD;
    GETWORD(CurrentStackPTR + 3) = (((UNSIGNED)EndSTKP - (UNSIGNED)(CurrentStackPTR + 2)) >> 1);
  }

  if (start68k)
    scanptr68k = start68k;
  else
    scanptr68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->stackbase);
  endstack68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->endofstack);

  if (STKWORD(endstack68k)->flags != STK_GUARD) printf("?? endstack is not GUARD BLK\n");

  while (scanptr68k < endstack68k) {
    switch ((unsigned)(STKWORD(scanptr68k)->flags)) {
      case STK_FSB:
        freesize = FSB_size(scanptr68k);
        if (freesize == 0) { warn("FSB freesize = 0!"); }
#ifdef FSBCHECK
        if (freesize > STACKAREA_SIZE + MINEXTRASTACKWORDS) {
          if (bigFSBindex < 100) {
            bigFSB[bigFSBindex].offset = StackOffsetFromNative(scanptr68k);
            bigFSB[bigFSBindex].size = freesize;
            bigFSBindex++;
          }
        }
#endif
        scanptr68k = (StackWord *)((DLword *)scanptr68k + freesize);
        putchar('F');
        break;

      case STK_GUARD:
        freesize = FSB_size(scanptr68k);
        if (freesize == 0) { warn("Guard block freesize = 0!"); }
        scanptr68k = (StackWord *)((DLword *)scanptr68k + freesize);
        putchar('G');
        break;

      case STK_FX:
        CHECK_FX((FX *)scanptr68k);
        scanptr68k = (StackWord *)NativeAligned2FromStackOffset(((FX *)scanptr68k)->nextblock);
        putchar('X');
        break;

      default:
        top_ivar = (DLword *)scanptr68k;
        while (STKWORD(scanptr68k)->flags != STK_BF) {
          if (STKWORD(scanptr68k)->flags != STK_NOTFLG) {
            WARN("StackCheck:!=STK_NOTFLG", printf("content:0x%x\n", GETWORD((DLword *)scanptr68k)));
          }
          scanptr68k = (StackWord *)((DLword *)scanptr68k + DLWORDSPER_CELL);
        } /* while end */
        CHECK_BF((Bframe *)scanptr68k);
        if (((Bframe *)scanptr68k)->residual) {
          if ((DLword *)scanptr68k != top_ivar)
            printf("Residual has real IVAR:0x%x\n", LAddrFromNative(scanptr68k));
        } else {
          if (((Bframe *)scanptr68k)->ivar != StackOffsetFromNative(top_ivar))
            printf("BF doesn't point TopIVAR:0x%x\n", LAddrFromNative(scanptr68k));
        }
        scanptr68k = (StackWord *)((DLword *)scanptr68k + DLWORDSPER_CELL);
        putchar('B');
        break;

    } /*switch end */

    if (scanptr68k != start68k) {
      if (scanptr68k > endstack68k) {
        WARN("scanptr exceeded end stack",
             printf("scanptr68k=%p endstack68k=%p", (void *)scanptr68k, (void *)endstack68k));
      }
    }
  } /* while end */

#ifdef FSBCHECK
  if (bigFSBindex != 0) {
    int i;

    printf("\nBIG FSB(s):\n");

    for (i = 0; i < bigFSBindex; i++) {
      printf("Offset: 0x%x , Size: 0x%x\n", bigFSB[i].offset, bigFSB[i].size);
    }
  }
#endif
  printf("\nStack Check done\n");
  if (setflg) {
    CURRENTFX->nextblock = save_nextblock;
    GETWORD(CurrentStackPTR + 2) = savestack1;
    GETWORD(CurrentStackPTR + 3) = savestack2;
  }

}